

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

double __thiscall S1Interval::GetComplementCenter(S1Interval *this)

{
  double dVar1;
  double dVar2;
  S1Interval SVar3;
  
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    SVar3 = Complement(this);
    dVar2 = (SVar3.bounds_.c_[0] + SVar3.bounds_.c_[1]) * 0.5;
    if (SVar3.bounds_.c_[1] < SVar3.bounds_.c_[0]) {
      dVar2 = dVar2 + *(double *)(&DAT_00278360 + (ulong)(dVar2 <= 0.0) * 8);
    }
  }
  else if (dVar2 <= 0.0) {
    dVar2 = dVar2 + 3.141592653589793;
  }
  else {
    dVar2 = dVar2 + -3.141592653589793;
  }
  return dVar2;
}

Assistant:

double S1Interval::GetComplementCenter() const {
  if (lo() != hi()) {
    return Complement().GetCenter();
  } else {  // Singleton.
    return (hi() <= 0) ? (hi() + M_PI) : (hi() - M_PI);
  }
}